

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void amrex::UtilCreateCleanDirectory(string *path,bool callbarrier)

{
  bool bVar1;
  ostream *os_;
  char *__new;
  byte in_SIL;
  string newoldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  allocator *paVar2;
  Print *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  Print *in_stack_fffffffffffffdd0;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffffdd8;
  Print *in_stack_fffffffffffffe10;
  string local_70 [32];
  string local_50 [32];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  bVar1 = ParallelContext::IOProcessorSub();
  if (bVar1) {
    bVar1 = FileExists((string *)0x11e7506);
    if (bVar1) {
      std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      UniqueString_abi_cxx11_();
      std::operator+(in_stack_fffffffffffffdd8,
                     (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                      *)in_stack_fffffffffffffdd0);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
      if (1 < system::verbose) {
        os_ = OutStream();
        Print::Print(in_stack_fffffffffffffdd0,os_);
        Print::operator<<(in_stack_fffffffffffffda0,(char (*) [37])in_stack_fffffffffffffd98);
        Print::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        Print::operator<<(in_stack_fffffffffffffda0,(char (*) [25])in_stack_fffffffffffffd98);
        Print::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        Print::operator<<(in_stack_fffffffffffffda0,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_fffffffffffffd98);
        Print::~Print(in_stack_fffffffffffffe10);
      }
      in_stack_fffffffffffffda0 = (Print *)std::__cxx11::string::c_str();
      __new = (char *)std::__cxx11::string::c_str();
      rename((char *)in_stack_fffffffffffffda0,__new);
      std::__cxx11::string::~string(local_30);
    }
    bVar1 = UtilCreateDirectory((string *)in_stack_fffffffffffffda0,
                                (mode_t)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                                SUB81((ulong)in_stack_fffffffffffffd98 >> 0x18,0));
    if (!bVar1) {
      CreateDirectoryFailed((string *)in_stack_fffffffffffffdd8);
    }
  }
  if ((local_9 & 1) != 0) {
    paVar2 = (allocator *)&stack0xfffffffffffffdd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffdd8,"amrex::UtilCreateCleanDirectory",paVar2);
    ParallelDescriptor::Barrier((string *)&stack0xfffffffffffffdd8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdd7);
  }
  return;
}

Assistant:

void
amrex::UtilCreateCleanDirectory (const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub()) {
    if(amrex::FileExists(path)) {
      std::string newoldname(path + ".old." + amrex::UniqueString());
      if (amrex::system::verbose > 1) {
          amrex::Print() << "amrex::UtilCreateCleanDirectory():  " << path
                         << " exists.  Renaming to:  " << newoldname << std::endl;
      }
      std::rename(path.c_str(), newoldname.c_str());
    }
    if( ! amrex::UtilCreateDirectory(path, 0755)) {
      amrex::CreateDirectoryFailed(path);
    }
  }
  if(callbarrier) {
    // Force other processors to wait until directory is built.
    ParallelDescriptor::Barrier("amrex::UtilCreateCleanDirectory");
  }
}